

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall
c4::yml::Tree::_next_node_modify(Tree *this,lookup_result *r,_lookup_path_token *parent)

{
  pfn_error p_Var1;
  NodeType_e NVar2;
  size_t i;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  NodeType_e NVar14;
  bool bVar15;
  NodeData *pNVar16;
  csubstr *pcVar17;
  size_t sVar18;
  size_t sVar19;
  uint *v;
  long lVar20;
  char *pcVar21;
  char *pcVar22;
  size_t sVar23;
  byte bVar24;
  csubstr str;
  csubstr cVar25;
  char msg [46];
  _lookup_path_token local_1f0;
  size_t pos;
  _lookup_path_token *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  csubstr cStack_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  csubstr cStack_180;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  csubstr cStack_158;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  csubstr cStack_130;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  csubstr cStack_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  csubstr cStack_e0;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  csubstr cStack_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  csubstr cStack_90;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  csubstr cStack_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  csubstr cStack_40;
  
  bVar24 = 0;
  _next_token(&local_1f0,this,r,parent);
  sVar19 = 0xffffffffffffffff;
  v = &switchD_001cf425::switchdataD_0020bef0;
  sVar18 = local_1f0.value.len;
  switch(local_1f0.type.type) {
  case NOTYPE:
    goto switchD_001cf425_caseD_0;
  default:
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      sVar19 = (*pcVar3)();
      return sVar19;
    }
    handle_error(0x20ca73,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x699e);
  case KEY:
    if ((((char *)local_1f0.value.len == (char *)0x0) || (*local_1f0.value.str != '[')) ||
       ((local_1f0.value.str + -1)[local_1f0.value.len] != ']')) {
      pcVar21 = "check failed: (token.value.begins_with(\'[\') && token.value.ends_with(\']\'))";
      pcVar22 = msg;
      for (lVar20 = 0x4b; lVar20 != 0; lVar20 = lVar20 + -1) {
        *pcVar22 = *pcVar21;
        pcVar21 = pcVar21 + (ulong)bVar24 * -2 + 1;
        pcVar22 = pcVar22 + (ulong)bVar24 * -2 + 1;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        sVar19 = (*pcVar3)();
        return sVar19;
      }
      p_Var1 = (this->m_callbacks).m_error;
      local_148 = 0;
      uStack_140 = 26999;
      local_138 = 0;
      cStack_130 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
      LVar7.super_LineCol.line._0_4_ = (int)uStack_140;
      LVar7.super_LineCol.offset = local_148;
      LVar7.super_LineCol.line._4_4_ = (int)((ulong)uStack_140 >> 0x20);
      LVar7.super_LineCol.col._0_4_ = (int)local_138;
      LVar7.super_LineCol.col._4_4_ = (int)((ulong)local_138 >> 0x20);
      LVar7.name.str._0_4_ = (int)cStack_130.str;
      LVar7.name.str._4_4_ = cStack_130.str._4_4_;
      LVar7.name.len = cStack_130.len;
      (*p_Var1)(msg,0x4b,LVar7,(this->m_callbacks).m_user_data);
      if ((char *)sVar18 == (char *)0x0) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          sVar19 = (*pcVar3)();
          return sVar19;
        }
        handle_error(0x20a4ad,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1560,"left >= 0 && left <= len");
      }
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)msg,local_1f0.value.str + 1,(size_t)(sVar18 + -2));
    pos._0_1_ = msg[0];
    pos._1_1_ = msg[1];
    pos._2_1_ = msg[2];
    pos._3_1_ = msg[3];
    pos._4_1_ = msg[4];
    pos._5_1_ = msg[5];
    pos._6_1_ = msg[6];
    pos._7_1_ = msg[7];
    local_1f0.value = basic_substring<const_char>::trim((basic_substring<const_char> *)&pos,' ');
    str.len = (size_t)&pos;
    str.str = (char *)local_1f0.value.len;
    bVar15 = atou<unsigned_long>((c4 *)local_1f0.value.str,str,&pos);
    if (!bVar15) {
      return 0xffffffffffffffff;
    }
    pNVar16 = _p(this,r->closest);
    if (((pNVar16->m_type).type & (STREAM|MAP)) == NOTYPE) {
      pNVar16 = _p(this,r->closest);
      if (((pNVar16->m_type).type & KEY) == NOTYPE) {
        _clear_type(this,r->closest);
        to_seq(this,r->closest,0);
      }
      else {
        pcVar17 = key(this,r->closest);
        cVar25 = *pcVar17;
        _clear_type(this,r->closest);
        to_seq(this,r->closest,cVar25,0);
      }
    }
    pNVar16 = _p(this,r->closest);
    if (((pNVar16->m_type).type & (STREAM|MAP)) == NOTYPE) {
      builtin_strncpy(msg + 0x10,"s_container(r->closest))",0x19);
      builtin_strncpy(msg,"check failed: (i",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        sVar19 = (*pcVar3)();
        return sVar19;
      }
      p_Var1 = (this->m_callbacks).m_error;
      local_170 = 0;
      uStack_168 = 0x698a;
      local_160 = 0;
      cStack_158 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
      LVar12.super_LineCol.line._0_4_ = (int)uStack_168;
      LVar12.super_LineCol.offset = local_170;
      LVar12.super_LineCol.line._4_4_ = (int)((ulong)uStack_168 >> 0x20);
      LVar12.super_LineCol.col._0_4_ = (int)local_160;
      LVar12.super_LineCol.col._4_4_ = (int)((ulong)local_160 >> 0x20);
      LVar12.name.str._0_4_ = (int)cStack_158.str;
      LVar12.name.str._4_4_ = cStack_158.str._4_4_;
      LVar12.name.len = cStack_158.len;
      (*p_Var1)(msg,0x29,LVar12,(this->m_callbacks).m_user_data);
    }
    sVar19 = child(this,r->closest,pos);
    if (sVar19 == 0xffffffffffffffff) {
      sVar19 = num_children(this,r->closest);
      if (pos < sVar19) {
        builtin_strncpy(msg + 0x10,"um_children(r->closest) <= idx",0x1e);
        builtin_strncpy(msg,"check failed: (n",0x10);
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          sVar19 = (*pcVar3)();
          return sVar19;
        }
        p_Var1 = (this->m_callbacks).m_error;
        local_198 = 0;
        uStack_190 = 0x698e;
        local_188 = 0;
        cStack_180 = to_csubstr(
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               );
        LVar13.super_LineCol.line._0_4_ = (int)uStack_190;
        LVar13.super_LineCol.offset = local_198;
        LVar13.super_LineCol.line._4_4_ = (int)((ulong)uStack_190 >> 0x20);
        LVar13.super_LineCol.col._0_4_ = (int)local_188;
        LVar13.super_LineCol.col._4_4_ = (int)((ulong)local_188 >> 0x20);
        LVar13.name.str._0_4_ = (int)cStack_180.str;
        LVar13.name.str._4_4_ = cStack_180.str._4_4_;
        LVar13.name.len = cStack_180.len;
        (*p_Var1)(msg,0x30,LVar13,(this->m_callbacks).m_user_data);
      }
      local_1c8 = parent;
      sVar18 = num_children(this,r->closest);
      sVar19 = 0xffffffffffffffff;
      for (; parent = local_1c8, sVar18 <= pos; sVar18 = sVar18 + 1) {
        sVar23 = r->closest;
        pNVar16 = _p(this,sVar23);
        i = pNVar16->m_last_child;
        if (sVar23 == 0xffffffffffffffff) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar3 = (code *)swi(3);
            sVar19 = (*pcVar3)();
            return sVar19;
          }
          cVar25 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = -0x4f;
          msg[9] = 'L';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg[0x18] = (char)cVar25.str;
          msg[0x19] = cVar25.str._1_1_;
          msg._26_2_ = cVar25.str._2_2_;
          msg[0x1c] = cVar25.str._4_1_;
          msg[0x1d] = cVar25.str._5_1_;
          msg[0x1e] = cVar25.str._6_1_;
          msg[0x1f] = cVar25.str._7_1_;
          msg[0x20] = (char)cVar25.len;
          msg[0x21] = cVar25.len._1_1_;
          msg[0x22] = cVar25.len._2_1_;
          msg[0x23] = cVar25.len._3_1_;
          msg._36_2_ = cVar25.len._4_2_;
          msg._38_2_ = cVar25.len._6_2_;
          (*(code *)PTR_error_impl_00246018)
                    ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks)
          ;
        }
        pNVar16 = _p(this,sVar23);
        if ((((pNVar16->m_type).type & (STREAM|MAP)) == NOTYPE) &&
           (bVar15 = is_root(this,sVar23), !bVar15)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar3 = (code *)swi(3);
            sVar19 = (*pcVar3)();
            return sVar19;
          }
          cVar25 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = -0x4e;
          msg[9] = 'L';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg[0x18] = (char)cVar25.str;
          msg[0x19] = cVar25.str._1_1_;
          msg._26_2_ = cVar25.str._2_2_;
          msg[0x1c] = cVar25.str._4_1_;
          msg[0x1d] = cVar25.str._5_1_;
          msg[0x1e] = cVar25.str._6_1_;
          msg[0x1f] = cVar25.str._7_1_;
          msg[0x20] = (char)cVar25.len;
          msg[0x21] = cVar25.len._1_1_;
          msg[0x22] = cVar25.len._2_1_;
          msg[0x23] = cVar25.len._3_1_;
          msg._36_2_ = cVar25.len._4_2_;
          msg._38_2_ = cVar25.len._6_2_;
          (*(code *)PTR_error_impl_00246018)
                    ("check failed: is_container(parent) || is_root(parent)",0x35,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if ((i != 0xffffffffffffffff) && (pNVar16 = _p(this,i), pNVar16->m_parent != sVar23)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar3 = (code *)swi(3);
            sVar19 = (*pcVar3)();
            return sVar19;
          }
          cVar25 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = -0x4d;
          msg[9] = 'L';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg[0x18] = (char)cVar25.str;
          msg[0x19] = cVar25.str._1_1_;
          msg._26_2_ = cVar25.str._2_2_;
          msg[0x1c] = cVar25.str._4_1_;
          msg[0x1d] = cVar25.str._5_1_;
          msg[0x1e] = cVar25.str._6_1_;
          msg[0x1f] = cVar25.str._7_1_;
          msg[0x20] = (char)cVar25.len;
          msg[0x21] = cVar25.len._1_1_;
          msg[0x22] = cVar25.len._2_1_;
          msg[0x23] = cVar25.len._3_1_;
          msg._36_2_ = cVar25.len._4_2_;
          msg._38_2_ = cVar25.len._6_2_;
          (*(code *)PTR_error_impl_00246018)
                    ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        sVar19 = _claim(this);
        _set_hierarchy(this,sVar19,sVar23,i);
        if (sVar18 < pos) {
          pNVar16 = _p(this,r->closest);
          if (((pNVar16->m_type).type & MAP) == NOTYPE) {
            pNVar16 = _p(this,r->closest);
            if (((pNVar16->m_type).type & SEQ) != NOTYPE) {
              to_val(this,sVar19,(csubstr)ZEXT816(0),0);
            }
          }
          else {
            to_keyval(this,sVar19,(csubstr)ZEXT816(0),(csubstr)ZEXT816(0),0);
          }
        }
      }
      break;
    }
    goto LAB_001d0207;
  case KEYVAL:
    cVar25 = lookup_result::unresolved(r);
    if (cVar25.str != (char *)0x0 && cVar25.len != 0) {
      builtin_strncpy(msg,"check failed: (r->unresolved().empty())",0x28);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        sVar19 = (*pcVar3)();
        return sVar19;
      }
      p_Var1 = (this->m_callbacks).m_error;
      local_f8 = 0;
      uStack_f0 = 0x6963;
      local_e8 = 0;
      cStack_e0 = to_csubstr(
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                            );
      LVar8.super_LineCol.line._0_4_ = (int)uStack_f0;
      LVar8.super_LineCol.offset = local_f8;
      LVar8.super_LineCol.line._4_4_ = (int)((ulong)uStack_f0 >> 0x20);
      LVar8.super_LineCol.col._0_4_ = (int)local_e8;
      LVar8.super_LineCol.col._4_4_ = (int)((ulong)local_e8 >> 0x20);
      LVar8.name.str._0_4_ = (int)cStack_e0.str;
      LVar8.name.str._4_4_ = cStack_e0.str._4_4_;
      LVar8.name.len = cStack_e0.len;
      (*p_Var1)(msg,0x28,LVar8,(this->m_callbacks).m_user_data);
    }
    pNVar16 = _p(this,r->closest);
    if (((pNVar16->m_type).type & MAP) == NOTYPE) {
      pNVar16 = _p(this,r->closest);
      if (((pNVar16->m_type).type & SEQ) != NOTYPE) {
        builtin_strncpy(msg + 0x10,"is_seq(r->closest))",0x14);
        builtin_strncpy(msg,"check failed: (!",0x10);
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          sVar19 = (*pcVar3)();
          return sVar19;
        }
        p_Var1 = (this->m_callbacks).m_error;
        local_120 = 0;
        uStack_118 = 0x696c;
        local_110 = 0;
        cStack_108 = to_csubstr(
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               );
        LVar9.super_LineCol.line._0_4_ = (int)uStack_118;
        LVar9.super_LineCol.offset = local_120;
        LVar9.super_LineCol.line._4_4_ = (int)((ulong)uStack_118 >> 0x20);
        LVar9.super_LineCol.col._0_4_ = (int)local_110;
        LVar9.super_LineCol.col._4_4_ = (int)((ulong)local_110 >> 0x20);
        LVar9.name.str._0_4_ = (int)cStack_108.str;
        LVar9.name.str._4_4_ = cStack_108.str._4_4_;
        LVar9.name.len = cStack_108.len;
        (*p_Var1)(msg,0x24,LVar9,(this->m_callbacks).m_user_data);
      }
      _add_flags(this,r->closest,MAP);
      sVar18 = r->closest;
      pNVar16 = _p(this,sVar18);
      sVar23 = pNVar16->m_last_child;
      if (sVar18 == 0xffffffffffffffff) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          sVar19 = (*pcVar3)();
          return sVar19;
        }
        cVar25 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x4f;
        msg[9] = 'L';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        msg[0x18] = (char)cVar25.str;
        msg[0x19] = cVar25.str._1_1_;
        msg._26_2_ = cVar25.str._2_2_;
        msg[0x1c] = cVar25.str._4_1_;
        msg[0x1d] = cVar25.str._5_1_;
        msg[0x1e] = cVar25.str._6_1_;
        msg[0x1f] = cVar25.str._7_1_;
        msg[0x20] = (char)cVar25.len;
        msg[0x21] = cVar25.len._1_1_;
        msg[0x22] = cVar25.len._2_1_;
        msg[0x23] = cVar25.len._3_1_;
        msg._36_2_ = cVar25.len._4_2_;
        msg._38_2_ = cVar25.len._6_2_;
        (*(code *)PTR_error_impl_00246018)
                  ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
      }
      pNVar16 = _p(this,sVar18);
      if ((((pNVar16->m_type).type & (STREAM|MAP)) == NOTYPE) &&
         (bVar15 = is_root(this,sVar18), !bVar15)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          sVar19 = (*pcVar3)();
          return sVar19;
        }
        cVar25 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x4e;
        msg[9] = 'L';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        msg[0x18] = (char)cVar25.str;
        msg[0x19] = cVar25.str._1_1_;
        msg._26_2_ = cVar25.str._2_2_;
        msg[0x1c] = cVar25.str._4_1_;
        msg[0x1d] = cVar25.str._5_1_;
        msg[0x1e] = cVar25.str._6_1_;
        msg[0x1f] = cVar25.str._7_1_;
        msg[0x20] = (char)cVar25.len;
        msg[0x21] = cVar25.len._1_1_;
        msg[0x22] = cVar25.len._2_1_;
        msg[0x23] = cVar25.len._3_1_;
        msg._36_2_ = cVar25.len._4_2_;
        msg._38_2_ = cVar25.len._6_2_;
        (*(code *)PTR_error_impl_00246018)
                  ("check failed: is_container(parent) || is_root(parent)",0x35,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((sVar23 != 0xffffffffffffffff) && (pNVar16 = _p(this,sVar23), pNVar16->m_parent != sVar18)
         ) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          sVar19 = (*pcVar3)();
          return sVar19;
        }
LAB_001cfceb:
        cVar25 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x4d;
        msg[9] = 'L';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        msg[0x18] = (char)cVar25.str;
        msg[0x19] = cVar25.str._1_1_;
        msg._26_2_ = cVar25.str._2_2_;
        msg[0x1c] = cVar25.str._4_1_;
        msg[0x1d] = cVar25.str._5_1_;
        msg[0x1e] = cVar25.str._6_1_;
        msg[0x1f] = cVar25.str._7_1_;
        msg[0x20] = (char)cVar25.len;
        msg[0x21] = cVar25.len._1_1_;
        msg[0x22] = cVar25.len._2_1_;
        msg[0x23] = cVar25.len._3_1_;
        msg._36_2_ = cVar25.len._4_2_;
        msg._38_2_ = cVar25.len._6_2_;
        (*(code *)PTR_error_impl_00246018)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
LAB_001cfd4a:
      sVar19 = _claim(this);
      _set_hierarchy(this,sVar19,sVar18,sVar23);
    }
    else {
      sVar19 = find_child(this,r->closest,&local_1f0.value);
      if (sVar19 == 0xffffffffffffffff) {
        sVar18 = r->closest;
        pNVar16 = _p(this,sVar18);
        sVar23 = pNVar16->m_last_child;
        if (sVar18 == 0xffffffffffffffff) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar3 = (code *)swi(3);
            sVar19 = (*pcVar3)();
            return sVar19;
          }
          cVar25 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = -0x4f;
          msg[9] = 'L';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg[0x18] = (char)cVar25.str;
          msg[0x19] = cVar25.str._1_1_;
          msg._26_2_ = cVar25.str._2_2_;
          msg[0x1c] = cVar25.str._4_1_;
          msg[0x1d] = cVar25.str._5_1_;
          msg[0x1e] = cVar25.str._6_1_;
          msg[0x1f] = cVar25.str._7_1_;
          msg[0x20] = (char)cVar25.len;
          msg[0x21] = cVar25.len._1_1_;
          msg[0x22] = cVar25.len._2_1_;
          msg[0x23] = cVar25.len._3_1_;
          msg._36_2_ = cVar25.len._4_2_;
          msg._38_2_ = cVar25.len._6_2_;
          (*(code *)PTR_error_impl_00246018)
                    ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks)
          ;
        }
        pNVar16 = _p(this,sVar18);
        if ((((pNVar16->m_type).type & (STREAM|MAP)) == NOTYPE) &&
           (bVar15 = is_root(this,sVar18), !bVar15)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar3 = (code *)swi(3);
            sVar19 = (*pcVar3)();
            return sVar19;
          }
          cVar25 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = -0x4e;
          msg[9] = 'L';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg[0x18] = (char)cVar25.str;
          msg[0x19] = cVar25.str._1_1_;
          msg._26_2_ = cVar25.str._2_2_;
          msg[0x1c] = cVar25.str._4_1_;
          msg[0x1d] = cVar25.str._5_1_;
          msg[0x1e] = cVar25.str._6_1_;
          msg[0x1f] = cVar25.str._7_1_;
          msg[0x20] = (char)cVar25.len;
          msg[0x21] = cVar25.len._1_1_;
          msg[0x22] = cVar25.len._2_1_;
          msg[0x23] = cVar25.len._3_1_;
          msg._36_2_ = cVar25.len._4_2_;
          msg._38_2_ = cVar25.len._6_2_;
          (*(code *)PTR_error_impl_00246018)
                    ("check failed: is_container(parent) || is_root(parent)",0x35,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if ((sVar23 != 0xffffffffffffffff) &&
           (pNVar16 = _p(this,sVar23), pNVar16->m_parent != sVar18)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar3 = (code *)swi(3);
            sVar19 = (*pcVar3)();
            return sVar19;
          }
          goto LAB_001cfceb;
        }
        goto LAB_001cfd4a;
      }
    }
    pNVar16 = _p(this,sVar19);
    (pNVar16->m_key).scalar.str = local_1f0.value.str;
    (pNVar16->m_key).scalar.len = local_1f0.value.len;
    (pNVar16->m_val).scalar.str = "";
    (pNVar16->m_val).scalar.len = 0;
    *(undefined1 *)&(pNVar16->m_type).type = (char)(pNVar16->m_type).type | KEYVAL;
    break;
  case MAP:
  case SEQ:
    if (((char *)local_1f0.value.len != (char *)0x0) && (*local_1f0.value.str == '[')) {
      builtin_strncpy(msg + 0x10,"token.value.begins_with(\'[\'))",0x1e);
      builtin_strncpy(msg,"check failed: (!",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        sVar19 = (*pcVar3)();
        return sVar19;
      }
      p_Var1 = (this->m_callbacks).m_error;
      local_58 = 0;
      uStack_50 = 0x6943;
      local_48 = 0;
      cStack_40 = to_csubstr(
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                            );
      LVar4.super_LineCol.line._0_4_ = (int)uStack_50;
      LVar4.super_LineCol.offset = local_58;
      LVar4.super_LineCol.line._4_4_ = (int)((ulong)uStack_50 >> 0x20);
      LVar4.super_LineCol.col._0_4_ = (int)local_48;
      LVar4.super_LineCol.col._4_4_ = (int)((ulong)local_48 >> 0x20);
      LVar4.name.str._0_4_ = (int)cStack_40.str;
      LVar4.name.str._4_4_ = cStack_40.str._4_4_;
      LVar4.name.len = cStack_40.len;
      (*p_Var1)(msg,0x2e,LVar4,(this->m_callbacks).m_user_data);
    }
    pNVar16 = _p(this,r->closest);
    NVar14 = (pNVar16->m_type).type;
    pNVar16 = _p(this,r->closest);
    NVar2 = (pNVar16->m_type).type;
    if ((NVar14 & (STREAM|MAP)) == NOTYPE) {
      sVar19 = r->closest;
      if ((NVar2 & KEY) == NOTYPE) {
        to_map(this,sVar19,0);
      }
      else {
        pcVar17 = key(this,sVar19);
        to_map(this,sVar19,*pcVar17,0);
      }
    }
    else {
      if ((NVar2 & MAP) == NOTYPE) {
        pos = 0xffffffffffffffff;
        cVar25.len = (size_t)&pos;
        cVar25.str = (char *)sVar18;
        bVar15 = atou<unsigned_long>((c4 *)local_1f0.value.str,cVar25,(unsigned_long *)v);
        if (!bVar15) {
          builtin_strncpy(msg + 0x10,"::atox(token.value, &pos)",0x1a);
          builtin_strncpy(msg,"check failed: c4",0x10);
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar3 = (code *)swi(3);
            sVar19 = (*pcVar3)();
            return sVar19;
          }
          p_Var1 = (this->m_callbacks).m_error;
          local_80 = 0;
          uStack_78 = 0x6953;
          local_70 = 0;
          cStack_68 = to_csubstr(
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                );
          LVar5.super_LineCol.line._0_4_ = (int)uStack_78;
          LVar5.super_LineCol.offset = local_80;
          LVar5.super_LineCol.line._4_4_ = (int)((ulong)uStack_78 >> 0x20);
          LVar5.super_LineCol.col._0_4_ = (int)local_70;
          LVar5.super_LineCol.col._4_4_ = (int)((ulong)local_70 >> 0x20);
          LVar5.name.str._0_4_ = (int)cStack_68.str;
          LVar5.name.str._4_4_ = cStack_68.str._4_4_;
          LVar5.name.len = cStack_68.len;
          (*p_Var1)(msg,0x2a,LVar5,(this->m_callbacks).m_user_data);
        }
        if (pos == 0xffffffffffffffff) {
          builtin_strncpy(msg + 0x10,"os != NONE)",0xc);
          builtin_strncpy(msg,"check failed: (p",0x10);
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar3 = (code *)swi(3);
            sVar19 = (*pcVar3)();
            return sVar19;
          }
          p_Var1 = (this->m_callbacks).m_error;
          local_a8 = 0;
          uStack_a0 = 0x6954;
          local_98 = 0;
          cStack_90 = to_csubstr(
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                );
          LVar6.super_LineCol.line._0_4_ = (int)uStack_a0;
          LVar6.super_LineCol.offset = local_a8;
          LVar6.super_LineCol.line._4_4_ = (int)((ulong)uStack_a0 >> 0x20);
          LVar6.super_LineCol.col._0_4_ = (int)local_98;
          LVar6.super_LineCol.col._4_4_ = (int)((ulong)local_98 >> 0x20);
          LVar6.name.str._0_4_ = (int)cStack_90.str;
          LVar6.name.str._4_4_ = cStack_90.str._4_4_;
          LVar6.name.len = cStack_90.len;
          (*p_Var1)(msg,0x1c,LVar6,(this->m_callbacks).m_user_data);
        }
        sVar19 = child(this,r->closest,pos);
      }
      else {
        sVar19 = find_child(this,r->closest,&local_1f0.value);
      }
      if (sVar19 != 0xffffffffffffffff) goto LAB_001d0207;
    }
    pNVar16 = _p(this,r->closest);
    if (((pNVar16->m_type).type & MAP) == NOTYPE) {
      builtin_strncpy(msg + 0x10,"s_map(r->closest))",0x13);
      builtin_strncpy(msg,"check failed: (i",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        sVar19 = (*pcVar3)();
        return sVar19;
      }
      p_Var1 = (this->m_callbacks).m_error;
      local_d0 = 0;
      uStack_c8 = 0x695a;
      local_c0 = 0;
      cStack_b8 = to_csubstr(
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                            );
      LVar10.super_LineCol.line._0_4_ = (int)uStack_c8;
      LVar10.super_LineCol.offset = local_d0;
      LVar10.super_LineCol.line._4_4_ = (int)((ulong)uStack_c8 >> 0x20);
      LVar10.super_LineCol.col._0_4_ = (int)local_c0;
      LVar10.super_LineCol.col._4_4_ = (int)((ulong)local_c0 >> 0x20);
      LVar10.name.str._0_4_ = (int)cStack_b8.str;
      LVar10.name.str._4_4_ = cStack_b8.str._4_4_;
      LVar10.name.len = cStack_b8.len;
      (*p_Var1)(msg,0x23,LVar10,(this->m_callbacks).m_user_data);
    }
    sVar18 = r->closest;
    pNVar16 = _p(this,sVar18);
    sVar23 = pNVar16->m_last_child;
    if (sVar18 == 0xffffffffffffffff) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        sVar19 = (*pcVar3)();
        return sVar19;
      }
      cVar25 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = -0x4f;
      msg[9] = 'L';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      msg[0x18] = (char)cVar25.str;
      msg[0x19] = cVar25.str._1_1_;
      msg._26_2_ = cVar25.str._2_2_;
      msg[0x1c] = cVar25.str._4_1_;
      msg[0x1d] = cVar25.str._5_1_;
      msg[0x1e] = cVar25.str._6_1_;
      msg[0x1f] = cVar25.str._7_1_;
      msg[0x20] = (char)cVar25.len;
      msg[0x21] = cVar25.len._1_1_;
      msg[0x22] = cVar25.len._2_1_;
      msg[0x23] = cVar25.len._3_1_;
      msg._36_2_ = cVar25.len._4_2_;
      msg._38_2_ = cVar25.len._6_2_;
      (*(code *)PTR_error_impl_00246018)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
    }
    pNVar16 = _p(this,sVar18);
    if ((((pNVar16->m_type).type & (STREAM|MAP)) == NOTYPE) &&
       (bVar15 = is_root(this,sVar18), !bVar15)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        sVar19 = (*pcVar3)();
        return sVar19;
      }
      cVar25 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = -0x4e;
      msg[9] = 'L';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      msg[0x18] = (char)cVar25.str;
      msg[0x19] = cVar25.str._1_1_;
      msg._26_2_ = cVar25.str._2_2_;
      msg[0x1c] = cVar25.str._4_1_;
      msg[0x1d] = cVar25.str._5_1_;
      msg[0x1e] = cVar25.str._6_1_;
      msg[0x1f] = cVar25.str._7_1_;
      msg[0x20] = (char)cVar25.len;
      msg[0x21] = cVar25.len._1_1_;
      msg[0x22] = cVar25.len._2_1_;
      msg[0x23] = cVar25.len._3_1_;
      msg._36_2_ = cVar25.len._4_2_;
      msg._38_2_ = cVar25.len._6_2_;
      (*(code *)PTR_error_impl_00246018)
                ("check failed: is_container(parent) || is_root(parent)",0x35,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((sVar23 != 0xffffffffffffffff) && (pNVar16 = _p(this,sVar23), pNVar16->m_parent != sVar18))
    {
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        sVar19 = (*pcVar3)();
        return sVar19;
      }
      cVar25 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = -0x4d;
      msg[9] = 'L';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      msg[0x18] = (char)cVar25.str;
      msg[0x19] = cVar25.str._1_1_;
      msg._26_2_ = cVar25.str._2_2_;
      msg[0x1c] = cVar25.str._4_1_;
      msg[0x1d] = cVar25.str._5_1_;
      msg[0x1e] = cVar25.str._6_1_;
      msg[0x1f] = cVar25.str._7_1_;
      msg[0x20] = (char)cVar25.len;
      msg[0x21] = cVar25.len._1_1_;
      msg[0x22] = cVar25.len._2_1_;
      msg[0x23] = cVar25.len._3_1_;
      msg._36_2_ = cVar25.len._4_2_;
      msg._38_2_ = cVar25.len._6_2_;
      (*(code *)PTR_error_impl_00246018)
                ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    sVar19 = _claim(this);
    _set_hierarchy(this,sVar19,sVar18,sVar23);
    pNVar16 = _p(this,sVar19);
    (pNVar16->m_key).scalar.str = local_1f0.value.str;
    (pNVar16->m_key).scalar.len = local_1f0.value.len;
    *(undefined1 *)&(pNVar16->m_type).type = (char)(pNVar16->m_type).type | KEY;
  }
  if (sVar19 == 0xffffffffffffffff) {
    builtin_strncpy(msg + 0x10,"ode != NONE)",0xd);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      sVar19 = (*pcVar3)();
      return sVar19;
    }
    p_Var1 = (this->m_callbacks).m_error;
    local_1c0 = 0;
    uStack_1b8 = 0x69a1;
    local_1b0 = 0;
    cStack_1a8 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
    LVar11.super_LineCol.line._0_4_ = (int)uStack_1b8;
    LVar11.super_LineCol.offset = local_1c0;
    LVar11.super_LineCol.line._4_4_ = (int)((ulong)uStack_1b8 >> 0x20);
    LVar11.super_LineCol.col._0_4_ = (int)local_1b0;
    LVar11.super_LineCol.col._4_4_ = (int)((ulong)local_1b0 >> 0x20);
    LVar11.name.str._0_4_ = (int)cStack_1a8.str;
    LVar11.name.str._4_4_ = cStack_1a8.str._4_4_;
    LVar11.name.len = cStack_1a8.len;
    (*p_Var1)(msg,0x1d,LVar11,(this->m_callbacks).m_user_data);
    sVar19 = 0xffffffffffffffff;
  }
LAB_001d0207:
  (parent->type).type = local_1f0.type.type;
  (parent->value).str = local_1f0.value.str;
  (parent->value).len = local_1f0.value.len;
switchD_001cf425_caseD_0:
  return sVar19;
}

Assistant:

size_t Tree::_next_node_modify(lookup_result * r, _lookup_path_token *parent)
{
    _lookup_path_token token = _next_token(r, *parent);
    if( ! token)
        return NONE;

    size_t node = NONE;
    if(token.type == MAP || token.type == SEQ)
    {
        _RYML_CB_ASSERT(m_callbacks, !token.value.begins_with('['));
        //_RYML_CB_ASSERT(m_callbacks, is_container(r->closest) || r->closest == NONE);
        if( ! is_container(r->closest))
        {
            if(has_key(r->closest))
                to_map(r->closest, key(r->closest));
            else
                to_map(r->closest);
        }
        else
        {
            if(is_map(r->closest))
                node = find_child(r->closest, token.value);
            else
            {
                size_t pos = NONE;
                _RYML_CB_CHECK(m_callbacks, c4::atox(token.value, &pos));
                _RYML_CB_ASSERT(m_callbacks, pos != NONE);
                node = child(r->closest, pos);
            }
        }
        if(node == NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, is_map(r->closest));
            node = append_child(r->closest);
            NodeData *n = _p(node);
            n->m_key.scalar = token.value;
            n->m_type.add(KEY);
        }
    }
    else if(token.type == KEYVAL)
    {
        _RYML_CB_ASSERT(m_callbacks, r->unresolved().empty());
        if(is_map(r->closest))
        {
            node = find_child(r->closest, token.value);
            if(node == NONE)
                node = append_child(r->closest);
        }
        else
        {
            _RYML_CB_ASSERT(m_callbacks, !is_seq(r->closest));
            _add_flags(r->closest, MAP);
            node = append_child(r->closest);
        }
        NodeData *n = _p(node);
        n->m_key.scalar = token.value;
        n->m_val.scalar = "";
        n->m_type.add(KEYVAL);
    }
    else if(token.type == KEY)
    {
        _RYML_CB_ASSERT(m_callbacks, token.value.begins_with('[') && token.value.ends_with(']'));
        token.value = token.value.offs(1, 1).trim(' ');
        size_t idx;
        if( ! from_chars(token.value, &idx))
             return NONE;
        if( ! is_container(r->closest))
        {
            if(has_key(r->closest))
            {
                csubstr k = key(r->closest);
                _clear_type(r->closest);
                to_seq(r->closest, k);
            }
            else
            {
                _clear_type(r->closest);
                to_seq(r->closest);
            }
        }
        _RYML_CB_ASSERT(m_callbacks, is_container(r->closest));
        node = child(r->closest, idx);
        if(node == NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, num_children(r->closest) <= idx);
            for(size_t i = num_children(r->closest); i <= idx; ++i)
            {
                node = append_child(r->closest);
                if(i < idx)
                {
                    if(is_map(r->closest))
                        to_keyval(node, /*"~"*/{}, /*"~"*/{});
                    else if(is_seq(r->closest))
                        to_val(node, /*"~"*/{});
                }
            }
        }
    }
    else
    {
        C4_NEVER_REACH();
    }

    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    *parent = token;
    return node;
}